

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxel.h
# Opt level: O1

voxel __thiscall ocmesh::details::voxel::neighbor(voxel *this,face d)

{
  short *psVar1;
  u16vec3 uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  undefined7 in_register_00000031;
  short sVar6;
  short sVar7;
  u16vec3 coordinates;
  undefined4 local_28;
  anon_union_2_3_4e909dac_for_tvec3<unsigned_short,_(glm::precision)0>_6 local_24;
  voxel local_20;
  
  uVar4 = (uint)CONCAT71(in_register_00000031,d);
  uVar5 = 0;
  if (right < d) {
    uVar5 = ((d & ~right) != bottom) + 1;
  }
  uVar2 = voxel::coordinates(this);
  local_28 = uVar2._0_4_;
  local_24.z = uVar2.field_2;
  uVar3 = (ulong)uVar5;
  if ((uVar4 < 6) && ((0x2aU >> (uVar4 & 0x1f) & 1) != 0)) {
    uVar5 = 1;
    if (!CARRY2((ushort)(1 << (0xd - ((byte)((uint)this->_code >> 0x15) & 0xf) & 0x1f)),
                *(ushort *)((long)&local_28 + uVar3 * 2))) goto LAB_00104b30;
    if ((d < (back|bottom)) && ((0x2aU >> (d & 0x1f) & 1) != 0)) {
      uVar5 = 0;
      goto LAB_00104b30;
    }
  }
  uVar5 = (uint)(*(short *)((long)&local_28 + uVar3 * 2) != 0);
LAB_00104b30:
  uVar4 = (uint)this->_code;
  sVar7 = (short)(1 << (0xd - ((byte)(uVar4 >> 0x15) & 0xf) & 0x1f));
  sVar6 = -1;
  if ((d & ~bottom) == right) {
    sVar6 = sVar7;
  }
  if (d == front) {
    sVar6 = sVar7;
  }
  sVar7 = (short)uVar5;
  psVar1 = (short *)((long)&local_28 + uVar3 * 2);
  *psVar1 = *psVar1 + sVar6 * sVar7;
  voxel(&local_20,
        (u16vec3)((uint6)(ushort)((short)local_28 * sVar7) |
                 (uint6)(ushort)(local_28._2_2_ * sVar7) << 0x10 |
                 (uint6)(ushort)(local_24.z * sVar7) << 0x20),(char)uVar5 * '\r',
        (uVar4 & 0x1fffff) * uVar5);
  return (voxel)local_20._code;
}

Assistant:

inline
voxel voxel::neighbor(face d) const
{
    /*
     * This will maybe be the most frequently called function in the entire
     * application, so we have to increase a bit its complexity to avoid
     * branches. Everything is computed in one linear flow control.
     */
    // First we choose if we need to add the size or subtract 1
    bool add_size = d == right  ||
                    d == top    ||
                    d == front;
    
    // Select the index of the coordinate to change.
    // Note: these ternary operators are probably not compiled as branches
    // TODO: Check the above statement
    uint8_t index = d == left || d == right  ? 0 :
                    d == top  || d == bottom ? 1 : 2 ;
    
    // Get the coordinates of the voxel
    glm::u16vec3 coordinates = this->coordinates();
    
    // Check if we have a neighbor at all
    uint16_t has_neighbor =
        (add_size && add_is_safe(coordinates[index], size())) ||
        (!add_size && coordinates[index] > 0);
    
    // We add the size if add_size is true,
    // or we add -1 if add_size is false,
    // but only if the neighbor actually exists
    coordinates[index] += has_neighbor * (add_size * size() - (!add_size));

    // Build the new voxel. If has_neighbor is false we obtain a void voxel.
    return voxel(has_neighbor * coordinates,
                 has_neighbor * max_level,
                 has_neighbor * material());
}